

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

string * __thiscall
cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,char *makefile,
          string *tgt)

{
  cmOutputConverter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *pcVar2;
  char *pcVar3;
  string tgt2;
  allocator local_79;
  string local_78;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_78,makefile,&local_79);
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat(&local_58,this_00,&local_78,SHELL);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  if ((pcVar2->MakeSilentFlag)._M_string_length != 0) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(pcVar2->MakeSilentFlag)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (pcVar2[1].MakeSilentFlag.field_2._M_local_buf[1] == '\x01') {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (tgt->_M_string_length != 0) {
    pcVar3 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
    std::__cxx11::string::string((string *)&local_78,pcVar3,&local_79);
    MaybeConvertToRelativePath(&local_58,this,&local_78,tgt);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::ConvertToOutputSlashes(&local_58);
    if (this->MakeCommandEscapeTargetTwice == true) {
      cmOutputConverter::EscapeForShell(&local_78,this_00,&local_58,true,false,false);
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    cmOutputConverter::EscapeForShell(&local_78,this_00,&local_58,true,false,false);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall(
  const char* makefile, const std::string& tgt)
{
  // Call make on the given file.
  std::string cmd;
  cmd += "$(MAKE) -f ";
  cmd += this->ConvertToOutputFormat(makefile, cmOutputConverter::SHELL);
  cmd += " ";

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  // Pass down verbosity level.
  if (!gg->MakeSilentFlag.empty()) {
    cmd += gg->MakeSilentFlag;
    cmd += " ";
  }

  // Most unix makes will pass the command line flags to make down to
  // sub-invoked makes via an environment variable.  However, some
  // makes do not support that, so you have to pass the flags
  // explicitly.
  if (gg->PassMakeflags) {
    cmd += "-$(MAKEFLAGS) ";
  }

  // Add the target.
  if (!tgt.empty()) {
    // The make target is always relative to the top of the build tree.
    std::string tgt2 =
      this->MaybeConvertToRelativePath(this->GetBinaryDirectory(), tgt);

    // The target may have been written with windows paths.
    cmSystemTools::ConvertToOutputSlashes(tgt2);

    // Escape one extra time if the make tool requires it.
    if (this->MakeCommandEscapeTargetTwice) {
      tgt2 = this->EscapeForShell(tgt2, true, false);
    }

    // The target name is now a string that should be passed verbatim
    // on the command line.
    cmd += this->EscapeForShell(tgt2, true, false);
  }
  return cmd;
}